

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int urlq_uparse(char *url,size_t sz,urlq_getopt_t *opts)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  uint *in_RDX;
  coda_url out;
  int rc;
  coda_url *in_stack_ffffffffffffff68;
  coda_url *in_stack_ffffffffffffff70;
  uint32_t flags;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  coda_url *in_stack_ffffffffffffff88;
  coda_url local_48;
  int local_24;
  uint *local_20;
  int local_4;
  
  local_20 = in_RDX;
  coda_url::coda_url(&local_48);
  bVar1 = coda_url::empty((coda_url *)(local_20 + 2));
  flags = (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  if (bVar1) {
    local_24 = coda_url::create_absolute
                         (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff78,flags);
  }
  else {
    local_24 = coda_url::create_relative
                         (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff78,flags,in_stack_ffffffffffffff68);
  }
  if (local_24 == 0) {
    if (((byte)*local_20 >> 3 & 1) == 0) {
      in_stack_ffffffffffffff70 = (coda_url *)0x10c4bc;
    }
    else {
      in_stack_ffffffffffffff70 = (coda_url *)coda_url::get_domain(in_stack_ffffffffffffff70);
    }
    pcVar2 = "";
    if ((*local_20 >> 3 & 1) != 0) {
      pcVar2 = "|";
    }
    pcVar3 = coda_url::get_url(in_stack_ffffffffffffff70);
    printf("%s%s%s\n",in_stack_ffffffffffffff70,pcVar2,pcVar3);
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  coda_url::~coda_url(in_stack_ffffffffffffff70);
  return local_4;
}

Assistant:

int urlq_uparse(const char *url, size_t sz, const urlq_getopt_t *opts)
{
    int rc;
    coda_url out;

    if (opts->parent.empty())
    {
        rc = out.create_absolute(url, sz, opts->uflags);
    }
    else
    {
        rc = out.create_relative(url, sz, opts->uflags, opts->parent);
    }

    if (0 != rc)
    {
        return -1;
    }

    printf("%s%s%s\n", opts->domain ? out.get_domain() : "",
        opts->domain ? "|" : "", out.get_url());

    return 0;
}